

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairTools.cpp
# Opt level: O0

void wirehair::SIMDSafeFree(void *ptr)

{
  long in_RDI;
  uint offset;
  uint8_t *data;
  
  if ((in_RDI != 0) && (*(byte *)(in_RDI + -1) < 0x20)) {
    free((void *)(in_RDI - (ulong)(0x20 - *(byte *)(in_RDI + -1))));
  }
  return;
}

Assistant:

void SIMDSafeFree(void* ptr)
{
    if (!ptr) {
        return;
    }
    uint8_t* data = (uint8_t*)ptr;
    unsigned offset = data[-1];
    if (offset >= GF256_ALIGN_BYTES) {
        CAT_DEBUG_BREAK(); // Should never happen
        return;
    }
    data -= GF256_ALIGN_BYTES - offset;
    free(data);
}